

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall cmake::HandleDeleteCacheVariables(cmake *this,string *var)

{
  cmState *pcVar1;
  pointer pSVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  string *path;
  SaveCacheEntry *i;
  pointer pbVar7;
  pointer key;
  allocator<char> local_269;
  vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> saved;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argsSplit;
  SaveCacheEntry save;
  string local_1c8;
  ostringstream warning;
  
  argsSplit.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  argsSplit.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  argsSplit.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&warning,(string *)var);
  cmSystemTools::ExpandListArgument((string *)&warning,&argsSplit,true);
  std::__cxx11::string::~string((string *)&warning);
  pcVar1 = this->State;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&warning,"__CMAKE_DELETE_CACHE_CHANGE_VARS_",(allocator<char> *)&save);
  cmState::SetGlobalProperty(pcVar1,(string *)&warning,"");
  std::__cxx11::string::~string((string *)&warning);
  bVar3 = cmState::GetIsInTryCompile(this->State);
  iVar4 = 0;
  if (!bVar3) {
    saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&warning);
    poVar5 = std::operator<<((ostream *)&warning,
                             "You have changed variables that require your cache to be deleted.\n");
    poVar5 = std::operator<<(poVar5,
                             "Configure will be re-run and you may have to reset some variables.\n")
    ;
    std::operator<<(poVar5,"The following variables have changed:\n");
    for (pbVar7 = argsSplit.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar7 != argsSplit.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 2) {
      save.key._M_dataplus._M_p = (pointer)&save.key.field_2;
      save.key._M_string_length = 0;
      save.key.field_2._M_local_buf[0] = '\0';
      save.value._M_dataplus._M_p = (pointer)&save.value.field_2;
      save.value._M_string_length = 0;
      save.value.field_2._M_local_buf[0] = '\0';
      save.help._M_dataplus._M_p = (pointer)&save.help.field_2;
      save.help._M_string_length = 0;
      save.help.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_assign((string *)&save);
      poVar5 = std::operator<<((ostream *)&warning,(string *)pbVar7);
      std::operator<<(poVar5,"= ");
      std::__cxx11::string::_M_assign((string *)&save.value);
      poVar5 = std::operator<<((ostream *)&warning,(string *)(pbVar7 + 1));
      std::operator<<(poVar5,"\n");
      pcVar6 = cmState::GetCacheEntryValue(this->State,&save.key);
      if (pcVar6 != (char *)0x0) {
        save.type = cmState::GetCacheEntryType(this->State,&save.key);
        pcVar1 = this->State;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c8,"HELPSTRING",&local_269);
        pcVar6 = cmState::GetCacheEntryProperty(pcVar1,&save.key,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        if (pcVar6 != (char *)0x0) {
          std::__cxx11::string::assign((char *)&save.help);
        }
      }
      std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::emplace_back<SaveCacheEntry>
                (&saved,&save);
      SaveCacheEntry::~SaveCacheEntry(&save);
    }
    path = GetHomeOutputDirectory_abi_cxx11_(this);
    DeleteCache(this,path);
    LoadCache(this);
    pSVar2 = saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (key = saved.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
               super__Vector_impl_data._M_start; key != pSVar2; key = key + 1) {
      AddCacheEntry(this,&key->key,(key->value)._M_dataplus._M_p,(key->help)._M_dataplus._M_p,
                    key->type);
    }
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message(&save.key,(char *)0x0);
    std::__cxx11::string::~string((string *)&save);
    bVar3 = cmSystemTools::GetErrorOccuredFlag();
    iVar4 = 0;
    if (!bVar3) {
      iVar4 = Configure(this);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&warning);
    std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::~vector(&saved);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&argsSplit);
  return iVar4;
}

Assistant:

int cmake::HandleDeleteCacheVariables(const std::string& var)
{
  std::vector<std::string> argsSplit;
  cmSystemTools::ExpandListArgument(std::string(var), argsSplit, true);
  // erase the property to avoid infinite recursion
  this->State->SetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_", "");
  if (this->State->GetIsInTryCompile()) {
    return 0;
  }
  std::vector<SaveCacheEntry> saved;
  std::ostringstream warning;
  /* clang-format off */
  warning
    << "You have changed variables that require your cache to be deleted.\n"
    << "Configure will be re-run and you may have to reset some variables.\n"
    << "The following variables have changed:\n";
  /* clang-format on */
  for (std::vector<std::string>::iterator i = argsSplit.begin();
       i != argsSplit.end(); ++i) {
    SaveCacheEntry save;
    save.key = *i;
    warning << *i << "= ";
    i++;
    save.value = *i;
    warning << *i << "\n";
    const char* existingValue = this->State->GetCacheEntryValue(save.key);
    if (existingValue) {
      save.type = this->State->GetCacheEntryType(save.key);
      if (const char* help =
            this->State->GetCacheEntryProperty(save.key, "HELPSTRING")) {
        save.help = help;
      }
    }
    saved.push_back(std::move(save));
  }

  // remove the cache
  this->DeleteCache(this->GetHomeOutputDirectory());
  // load the empty cache
  this->LoadCache();
  // restore the changed compilers
  for (SaveCacheEntry const& i : saved) {
    this->AddCacheEntry(i.key, i.value.c_str(), i.help.c_str(), i.type);
  }
  cmSystemTools::Message(warning.str());
  // avoid reconfigure if there were errors
  if (!cmSystemTools::GetErrorOccuredFlag()) {
    // re-run configure
    return this->Configure();
  }
  return 0;
}